

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

double array_max_abs(double *array,int N)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  
  if (0 < N) {
    uVar1 = 0;
    dVar3 = 0.0;
    do {
      dVar2 = ABS(array[uVar1]);
      if (ABS(array[uVar1]) <= dVar3) {
        dVar2 = dVar3;
      }
      uVar1 = uVar1 + 1;
      dVar3 = dVar2;
    } while ((uint)N != uVar1);
    return dVar2;
  }
  return 0.0;
}

Assistant:

double array_max_abs(double *array,int N) {
	int i;
	double m = 0.0;

	for (i = 0; i < N;++i) {
		if (fabs(array[i]) > m ) {
			m = fabs(array[i]);
		}
	}

	return m;
}